

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ShadowTableName(sqlite3 *db,char *zName)

{
  char *pcVar1;
  Table *pTab_00;
  Table *pTab;
  char *zTail;
  char *zName_local;
  sqlite3 *db_local;
  
  pcVar1 = strrchr(zName,0x5f);
  if (pcVar1 == (char *)0x0) {
    db_local._4_4_ = 0;
  }
  else {
    *pcVar1 = '\0';
    pTab_00 = sqlite3FindTable(db,zName,(char *)0x0);
    *pcVar1 = '_';
    if (pTab_00 == (Table *)0x0) {
      db_local._4_4_ = 0;
    }
    else if (pTab_00->eTabType == '\x01') {
      db_local._4_4_ = sqlite3IsShadowTableOf(db,pTab_00,zName);
    }
    else {
      db_local._4_4_ = 0;
    }
  }
  return db_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ShadowTableName(sqlite3 *db, const char *zName){
  char *zTail;                  /* Pointer to the last "_" in zName */
  Table *pTab;                  /* Table that zName is a shadow of */
  zTail = strrchr(zName, '_');
  if( zTail==0 ) return 0;
  *zTail = 0;
  pTab = sqlite3FindTable(db, zName, 0);
  *zTail = '_';
  if( pTab==0 ) return 0;
  if( !IsVirtual(pTab) ) return 0;
  return sqlite3IsShadowTableOf(db, pTab, zName);
}